

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O1

string<char> * __thiscall irr::core::string<char>::operator=(string<char> *this,unsigned_long *c)

{
  unsigned_long *puVar1;
  long lVar2;
  s32 l;
  char *pcVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  
  puVar1 = (unsigned_long *)this->array;
  if (c == (unsigned_long *)0x0) {
    if (puVar1 == (unsigned_long *)0x0) {
      pcVar3 = (char *)operator_new__(1);
      this->array = pcVar3;
      this->allocated = 1;
      this->used = 1;
    }
    *this->array = '\0';
  }
  else if (puVar1 != c) {
    if (*c == 0) {
      lVar6 = 0;
    }
    else {
      lVar6 = 0;
      do {
        lVar2 = lVar6 + 1;
        lVar6 = lVar6 + 1;
      } while (c[lVar2] != 0);
    }
    uVar5 = (int)lVar6 + 1;
    this->used = uVar5;
    this->allocated = uVar5;
    pcVar3 = (char *)operator_new__((ulong)uVar5);
    this->array = pcVar3;
    uVar4 = 0;
    do {
      this->array[uVar4] = (char)c[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
    if (puVar1 != (unsigned_long *)0x0) {
      operator_delete__(puVar1);
    }
  }
  return this;
}

Assistant:

string<T>& operator=(const B* c) 
	{
		if (!c)
		{
			if (!array)
			{
				array = new T[1];
				allocated = 1;
				used = 1;
			}
			array[0] = 0x0;
			return *this;
		}

		if ((void*)c == (void*)array)
			return *this;

		s32 len = 0;
		const B* p = c;
		while(*p)
		{
			++len;
			++p;
		}

		// we'll take the old string for a while, because the new string could be
		// a part of the current string.
		T* oldArray = array;

        allocated = used = len+1;
		array = new T[used];

		for (s32 l = 0; l<len+1; ++l)
			array[l] = (T)c[l];

		delete [] oldArray;
		return *this;
	}